

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

bool check_entwine(CHAR_DATA *ch,int type)

{
  AFFECT_DATA *af;
  int type_local;
  CHAR_DATA *ch_local;
  
  af = ch->affected;
  while( true ) {
    if (af == (AFFECT_DATA *)0x0) {
      return false;
    }
    if (((type == 0) && (af->type == gsn_entwine)) && (af->modifier == 0)) {
      return true;
    }
    if (((type == 1) && (af->type == gsn_entwine)) && (af->modifier == 1)) {
      return true;
    }
    if (((type == 2) && (af->type == gsn_entwine)) && (af->location == 2)) break;
    af = af->next;
  }
  return true;
}

Assistant:

bool check_entwine(CHAR_DATA *ch, int type)
{
	for (AFFECT_DATA *af = ch->affected; af != nullptr; af = af->next)
	{
		if (type == 0 && af->type == gsn_entwine && af->modifier == 0)
			return true;
		else if (type == 1 && af->type == gsn_entwine && af->modifier == 1)
			return true;
		else if (type == 2 && af->type == gsn_entwine && af->location == APPLY_DEX)
			return true;
	}

	return false;
}